

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptimizeInstructions.cpp
# Opt level: O1

Expression * __thiscall
wasm::OptimizeInstructions::simplifyRoundingsAndConversions(OptimizeInstructions *this,Unary *curr)

{
  ulong uVar1;
  Expression *pEVar2;
  Expression *pEVar3;
  Expression *pEVar4;
  
  uVar1 = (ulong)curr->op;
  if (0x37 < uVar1) {
    return (Expression *)0x0;
  }
  if ((0x3fc00UL >> (uVar1 & 0x3f) & 1) != 0) {
    pEVar2 = curr->value;
    if (pEVar2->_id != UnaryId) {
      return (Expression *)0x0;
    }
    if (7 < pEVar2[1]._id - SIMDLoadStoreLaneId) {
      return (Expression *)0x0;
    }
    return pEVar2;
  }
  if ((0x40000020000000U >> (uVar1 & 0x3f) & 1) == 0) {
    if ((0x80000080000000U >> (uVar1 & 0x3f) & 1) == 0) {
      return (Expression *)0x0;
    }
    pEVar2 = curr->value;
    pEVar3 = (Expression *)0x0;
    pEVar4 = pEVar3;
    if (pEVar2->_id != UnaryId) goto LAB_00800e2e;
    pEVar3 = pEVar2;
    if (pEVar2[1]._id == MemoryCopyId) {
LAB_00800e26:
      pEVar3 = (Expression *)pEVar2[1].type.id;
      pEVar4 = (Expression *)0x1;
      goto LAB_00800e2e;
    }
  }
  else {
    pEVar2 = curr->value;
    pEVar3 = (Expression *)0x0;
    pEVar4 = pEVar3;
    if (pEVar2->_id != UnaryId) goto LAB_00800e2e;
    pEVar3 = pEVar2;
    if (pEVar2[1]._id == MemoryInitId) goto LAB_00800e26;
  }
  pEVar4 = (Expression *)0x0;
LAB_00800e2e:
  if ((char)pEVar4 == '\0') {
    return (Expression *)0x0;
  }
  return pEVar3;
}

Assistant:

Expression* simplifyRoundingsAndConversions(Unary* curr) {
    using namespace Abstract;
    using namespace Match;

    switch (curr->op) {
      case TruncSFloat64ToInt32:
      case TruncSatSFloat64ToInt32: {
        // i32 -> f64 -> i32 rountripping optimization:
        //   i32.trunc(_sat)_f64_s(f64.convert_i32_s(x))  ==>  x
        Expression* x;
        if (matches(curr->value, unary(ConvertSInt32ToFloat64, any(&x)))) {
          return x;
        }
        break;
      }
      case TruncUFloat64ToInt32:
      case TruncSatUFloat64ToInt32: {
        // u32 -> f64 -> u32 rountripping optimization:
        //   i32.trunc(_sat)_f64_u(f64.convert_i32_u(x))  ==>  x
        Expression* x;
        if (matches(curr->value, unary(ConvertUInt32ToFloat64, any(&x)))) {
          return x;
        }
        break;
      }
      case CeilFloat32:
      case CeilFloat64:
      case FloorFloat32:
      case FloorFloat64:
      case TruncFloat32:
      case TruncFloat64:
      case NearestFloat32:
      case NearestFloat64: {
        // Rounding after integer to float conversion may be skipped
        //   ceil(float(int(x)))     ==>  float(int(x))
        //   floor(float(int(x)))    ==>  float(int(x))
        //   trunc(float(int(x)))    ==>  float(int(x))
        //   nearest(float(int(x)))  ==>  float(int(x))
        Unary* inner;
        if (matches(curr->value, unary(&inner, any()))) {
          switch (inner->op) {
            case ConvertSInt32ToFloat32:
            case ConvertSInt32ToFloat64:
            case ConvertUInt32ToFloat32:
            case ConvertUInt32ToFloat64:
            case ConvertSInt64ToFloat32:
            case ConvertSInt64ToFloat64:
            case ConvertUInt64ToFloat32:
            case ConvertUInt64ToFloat64: {
              return inner;
            }
            default: {
            }
          }
        }
        break;
      }
      default: {
      }
    }
    return nullptr;
  }